

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOMPI.cpp
# Opt level: O2

void adios2::core::RegisterMPIEngines(void)

{
  EngineFactoryEntry EVar1;
  undefined1 auVar2 [24];
  undefined1 in_stack_ffffffffffffff68 [48];
  
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff78,"ssc",(allocator *)&stack0xffffffffffffff77);
  EVar1.MakeWriter.super__Function_base._M_manager =
       anon_unknown_4::MakeEngineMPI<adios2::core::engine::SscReader>;
  auVar2 = SUB3224(in_stack_ffffffffffffff68._0_32_,0);
  EVar1.MakeReader.super__Function_base._M_functor = (_Any_data)auVar2._0_16_;
  EVar1.MakeReader.super__Function_base._M_manager = (_Manager_type)auVar2._16_8_;
  EVar1.MakeReader._M_invoker = (_Invoker_type)SUB328(in_stack_ffffffffffffff68._0_32_,0x18);
  EVar1.MakeWriter.super__Function_base._M_functor = (_Any_data)in_stack_ffffffffffffff68._32_16_;
  EVar1.MakeWriter._M_invoker = (_Invoker_type)0x0;
  EVar1.MakeReaderWithMD.super__Function_base._M_functor._M_unused._M_function_pointer =
       std::
       _Function_handler<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm),_std::shared_ptr<adios2::core::Engine>_(*)(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm)>
       ::_M_manager;
  EVar1.MakeReaderWithMD.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm),_std::shared_ptr<adios2::core::Engine>_(*)(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm)>
       ::_M_invoke;
  EVar1.MakeReaderWithMD.super__Function_base._M_manager =
       anon_unknown_4::MakeEngineMPI<adios2::core::engine::SscWriter>;
  EVar1.MakeReaderWithMD._M_invoker = (_Invoker_type)0x0;
  adios2::core::IO::RegisterEngine((string *)&stack0xffffffffffffff78,EVar1);
  IO::EngineFactoryEntry::~EngineFactoryEntry((EngineFactoryEntry *)&stack0xffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  return;
}

Assistant:

void RegisterMPIEngines()
{
    IO::RegisterEngine("ssc", IO::EngineFactoryEntry{MakeEngineMPI<engine::SscReader>,
                                                     MakeEngineMPI<engine::SscWriter>});
#ifdef ADIOS2_HAVE_DATASPACES
    IO::RegisterEngine("dataspaces",
                       IO::EngineFactoryEntry{MakeEngineMPI<engine::DataSpacesReader>,
                                              MakeEngineMPI<engine::DataSpacesWriter>});
#endif
#if defined(ADIOS2_HAVE_HDF5_PARALLEL)
    interop::RegisterHDF5Common_MPI_API();
#endif
}